

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

bool __thiscall Json::StreamWriterBuilder::validate(StreamWriterBuilder *this,Value *invalid)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  Value *other;
  Value *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  long lVar4;
  const_iterator cVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_141;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_140;
  allocator local_13f;
  allocator local_13e;
  allocator local_13d;
  allocator local_13c;
  allocator local_13b;
  allocator local_13a;
  allocator local_139;
  ValueIteratorBase local_138;
  String key;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  if ((validate(Json::Value*)::valid_keys_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&validate(Json::Value*)::valid_keys_abi_cxx11_), iVar2 != 0)) {
    this_01 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)operator_new(0x30);
    std::__cxx11::string::string((string *)&key,"indentation",(allocator *)&local_138);
    std::__cxx11::string::string(local_108,"commentStyle",&local_139);
    std::__cxx11::string::string(local_e8,"enableYAMLCompatibility",&local_13a);
    std::__cxx11::string::string(local_c8,"dropNullPlaceholders",&local_13b);
    std::__cxx11::string::string(local_a8,"useSpecialFloats",&local_13c);
    std::__cxx11::string::string(local_88,"emitUTF8",&local_13d);
    std::__cxx11::string::string(local_68,"precision",&local_13e);
    std::__cxx11::string::string(local_48,"precisionType",&local_13f);
    __l._M_len = 8;
    __l._M_array = &key;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(this_01,__l,&local_140,&local_141);
    lVar4 = 0xe0;
    do {
      std::__cxx11::string::~string(local_108 + lVar4 + -0x20);
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    validate(Json::Value*)::valid_keys_abi_cxx11_ = this_01;
    __cxa_guard_release(&validate(Json::Value*)::valid_keys_abi_cxx11_);
  }
  cVar5 = Value::begin(&this->settings_);
  local_138.current_ = cVar5.super_ValueIteratorBase.current_._M_node;
  local_138.isNull_ = cVar5.super_ValueIteratorBase.isNull_;
  do {
    cVar5 = Value::end(&this->settings_);
    key._M_dataplus._M_p = (pointer)cVar5.super_ValueIteratorBase.current_._M_node;
    key._M_string_length._0_1_ = cVar5.super_ValueIteratorBase.isNull_;
    bVar1 = ValueIteratorBase::operator!=(&local_138,(SelfType *)&key);
    if (!bVar1) {
      if (invalid == (Value *)0x0) {
        bVar1 = true;
      }
      else {
        bVar1 = Value::empty(invalid);
      }
      return bVar1;
    }
    ValueIteratorBase::name_abi_cxx11_(&key,&local_138);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(validate(Json::Value*)::valid_keys_abi_cxx11_,&key);
    if (sVar3 == 0) {
      if (invalid == (Value *)0x0) {
        std::__cxx11::string::~string((string *)&key);
        return false;
      }
      other = ValueIteratorBase::deref(&local_138);
      this_00 = Value::operator[](invalid,&key);
      Value::operator=(this_00,other);
    }
    std::__cxx11::string::~string((string *)&key);
    ValueIteratorBase::increment(&local_138);
  } while( true );
}

Assistant:

bool StreamWriterBuilder::validate(Json::Value* invalid) const {
  static const auto& valid_keys = *new std::set<String>{
      "indentation",
      "commentStyle",
      "enableYAMLCompatibility",
      "dropNullPlaceholders",
      "useSpecialFloats",
      "emitUTF8",
      "precision",
      "precisionType",
  };
  for (auto si = settings_.begin(); si != settings_.end(); ++si) {
    auto key = si.name();
    if (valid_keys.count(key))
      continue;
    if (invalid)
      (*invalid)[key] = *si;
    else
      return false;
  }
  return invalid ? invalid->empty() : true;
}